

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_nl.h
# Opt level: O2

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,1,mp::ItemNamer>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,NLBaseReif<1> *nlr,
               ItemNamer *vnam)

{
  BasicWriter<char> *this;
  char *__s;
  size_t sVar1;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  value.size_ = 0x13;
  value.data_ = "EXPLICIT REIF var: ";
  this = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
  __s = ItemNamer::at(vnam,(long)nlr->bvar_);
  sVar1 = strlen(__s);
  value_00.size_ = sVar1;
  value_00.data_ = __s;
  fmt::BasicWriter<char>::operator<<(this,value_00);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                           const NLBaseReif<sense>& nlr,
                           Names& vnam) {
  wrt << "EXPLICIT REIF var: " << vnam.at(nlr.GetBVar());
}